

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

AffineSpace3ff * __thiscall
embree::SceneGraph::Transformations::interpolate(Transformations *this,float gtime)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_RSI;
  AffineSpace3ff *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float ftime;
  int itime;
  float time;
  int time_segments;
  int local_b50;
  int local_b4c;
  float local_b30;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  
  if (*(long *)(in_RSI + 0x10) == 1) {
    puVar2 = *(undefined8 **)(in_RSI + 0x20);
    uVar1 = puVar2[1];
    *(undefined8 *)&(in_RDI->l).vx.field_0 = *puVar2;
    *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uVar1;
    uVar1 = puVar2[3];
    *(undefined8 *)&(in_RDI->l).vy.field_0 = puVar2[2];
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uVar1;
    uVar1 = puVar2[5];
    *(undefined8 *)&(in_RDI->l).vz.field_0 = puVar2[4];
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uVar1;
    uVar1 = puVar2[7];
    *(undefined8 *)&(in_RDI->p).field_0 = puVar2[6];
    *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uVar1;
  }
  else {
    local_b4c = (int)*(undefined8 *)(in_RSI + 0x10);
    fVar3 = in_XMM0_Da * (float)(local_b4c + -1);
    fVar4 = floorf(fVar3);
    local_b4c = local_b4c + -2;
    if ((int)fVar4 < local_b4c) {
      local_b4c = (int)fVar4;
    }
    local_b50 = 0;
    if (-1 < local_b4c) {
      local_b50 = local_b4c;
    }
    puVar2 = (undefined8 *)(*(long *)(in_RSI + 0x20) + (long)local_b50 * 0x40);
    fVar4 = 1.0 - (fVar3 - (float)local_b50);
    local_568 = (float)*puVar2;
    fStack_564 = (float)((ulong)*puVar2 >> 0x20);
    fStack_560 = (float)puVar2[1];
    fStack_55c = (float)((ulong)puVar2[1] >> 0x20);
    local_5e8 = (float)local_828;
    fStack_5e4 = (float)((ulong)local_828 >> 0x20);
    fStack_5e0 = (float)uStack_820;
    fStack_5dc = (float)((ulong)uStack_820 >> 0x20);
    fVar3 = 1.0 - local_b30;
    local_6a8 = (float)puVar2[6];
    fStack_6a4 = (float)((ulong)puVar2[6] >> 0x20);
    fStack_6a0 = (float)puVar2[7];
    fStack_69c = (float)((ulong)puVar2[7] >> 0x20);
    local_728 = (float)local_7f8;
    fStack_724 = (float)((ulong)local_7f8 >> 0x20);
    fStack_720 = (float)uStack_7f0;
    fStack_71c = (float)((ulong)uStack_7f0 >> 0x20);
    *(ulong *)&(in_RDI->l).vx.field_0 =
         CONCAT44(fVar4 * fStack_564 + fStack_5e4,fVar4 * local_568 + local_5e8);
    *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) =
         CONCAT44(fVar4 * fStack_55c + fStack_5dc,fVar4 * fStack_560 + fStack_5e0);
    *(undefined8 *)&(in_RDI->l).vy.field_0 = local_918;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_910;
    *(undefined8 *)&(in_RDI->l).vz.field_0 = local_928;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_920;
    *(ulong *)&(in_RDI->p).field_0 =
         CONCAT44(fVar3 * fStack_6a4 + fStack_724,fVar3 * local_6a8 + local_728);
    *(ulong *)((long)&(in_RDI->p).field_0 + 8) =
         CONCAT44(fVar3 * fStack_69c + fStack_71c,fVar3 * fStack_6a0 + fStack_720);
  }
  return in_RDI;
}

Assistant:

AffineSpace3ff interpolate (const float gtime) const
      {
        assert(time_range.lower == 0.0f && time_range.upper == 1.0f);
        if (spaces.size() == 1) return spaces[0];

        /* calculate time segment itime and fractional time ftime */
        const int time_segments = int(spaces.size()-1);
        const float time = gtime*float(time_segments);
        const int itime = clamp(int(floor(time)),0,time_segments-1);
        const float ftime = time - float(itime);
        return lerp(spaces[itime+0],spaces[itime+1],ftime);
      }